

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

void __thiscall wallet::coinselector_tests::bump_fee_test::test_method(bump_fee_test *this)

{
  undefined8 *puVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  long lVar4;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  CAmount local_188;
  lazy_ostream local_180;
  undefined1 *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  CAmount expected_waste;
  vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  inputs;
  CAmount *local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined1 *local_108;
  CAmount **local_100;
  CAmount *local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined1 *local_e0;
  CAmount **local_d8;
  char *local_d0;
  char *local_c8;
  assertion_result local_c0;
  SelectionResult selection;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = &selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection.m_target = 200000000;
  selection.m_algo = MANUAL;
  selection.m_use_effective = false;
  selection.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection.m_algo_completed = true;
  selection.m_weight = 0;
  selection.bump_fee_group_discount = 0;
  local_f0 = (undefined **)0x5f5e100;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&local_f0,1,&selection,100,0x8c);
  local_f0 = (undefined **)0xbebc200;
  pvVar5 = (iterator)0x8c;
  add_coin((CAmount *)&local_f0,2,&selection,100,0x8c);
  SelectionResult::GetShuffledInputVector(&inputs,&selection);
  uVar8 = 0xffffffffffffffff;
  lVar7 = 0;
  lVar4 = 0x14;
  while( true ) {
    uVar8 = uVar8 + 1;
    if ((ulong)((long)inputs.
                      super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)inputs.
                      super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar8) break;
    puVar1 = (undefined8 *)
             ((long)&((inputs.
                       super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar7
             );
    lVar7 = lVar7 + 0x10;
    COutput::ApplyBumpFee((COutput *)*puVar1,lVar4);
    lVar4 = lVar4 + 0x14;
  }
  SelectionResult::RecalculateWaste(&selection,200,0x7d,0x23);
  expected_waste = 0x69;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x403;
  file.m_begin = (iterator)&local_150;
  msg.m_end = in_R9;
  msg.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_188 = SelectionResult::GetWaste(&selection);
  local_120 = &local_188;
  local_f8 = &expected_waste;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(expected_waste == local_188);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_c8 = "";
  local_d8 = &local_f8;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013ae428;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae428;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xf87aab,(size_t)&local_d0,0x403,&local_f0,
             "selection.GetWaste()",&local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  SelectionResult::SetBumpFeeDiscount(&selection,0x1e);
  SelectionResult::RecalculateWaste(&selection,200,0x7d,0x23);
  expected_waste = 0x4b;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x408;
  file_00.m_begin = (iterator)&local_198;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
             msg_00);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_188 = SelectionResult::GetWaste(&selection);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(expected_waste == local_188);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &expected_waste;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013ae428;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_188;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae428;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xf87aab,(size_t)&local_d0,0x408,&local_f0,
             "selection.GetWaste()",&local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~vector(&inputs);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection);
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection.m_target = 0x11e1a1d4;
  selection.m_algo = MANUAL;
  selection.m_use_effective = false;
  selection.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection.m_algo_completed = true;
  selection.m_weight = 0;
  selection.bump_fee_group_discount = 0;
  local_f0 = (undefined **)0x5f5e100;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&local_f0,1,&selection,100,0x8c);
  local_f0 = (undefined **)0xbebc200;
  pvVar5 = (iterator)0x8c;
  add_coin((CAmount *)&local_f0,2,&selection,100,0x8c);
  SelectionResult::GetShuffledInputVector(&inputs,&selection);
  uVar8 = 0xffffffffffffffff;
  lVar7 = 0;
  lVar4 = 0x14;
  while( true ) {
    uVar8 = uVar8 + 1;
    if ((ulong)((long)inputs.
                      super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)inputs.
                      super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar8) break;
    puVar1 = (undefined8 *)
             ((long)&((inputs.
                       super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar7
             );
    lVar7 = lVar7 + 0x10;
    COutput::ApplyBumpFee((COutput *)*puVar1,lVar4);
    lVar4 = lVar4 + 0x14;
  }
  SelectionResult::RecalculateWaste(&selection,200,0x7d,0x23);
  expected_waste = 0x14;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x41d;
  file_01.m_begin = (iterator)&local_1b8;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c8,
             msg_01);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_188 = SelectionResult::GetWaste(&selection);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188 == 0x14);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &expected_waste;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013ae428;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_188;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae428;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xf87aab,(size_t)&local_d0,0x41d,&local_f0,
             "selection.GetWaste()",&local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  SelectionResult::SetBumpFeeDiscount(&selection,0x1e);
  SelectionResult::RecalculateWaste(&selection,200,0x7d,0x23);
  expected_waste = 0x14;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x422;
  file_02.m_begin = (iterator)&local_1d8;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e8,
             msg_02);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_188 = SelectionResult::GetWaste(&selection);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(expected_waste == local_188);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &expected_waste;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013ae428;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_188;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013ae428;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xf87aab,(size_t)&local_d0,0x422,&local_f0,
             "selection.GetWaste()",&local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~vector(&inputs);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bump_fee_test)
{
    const CAmount fee{100};
    const CAmount min_viable_change{200};
    const CAmount change_cost{125};
    const CAmount change_fee{35};
    const CAmount fee_diff{40};
    const CAmount target{2 * COIN};

    {
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, /*fee=*/fee, /*long_term_fee=*/fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        const std::vector<std::shared_ptr<COutput>> inputs = selection.GetShuffledInputVector();

        for (size_t i = 0; i < inputs.size(); ++i) {
            inputs[i]->ApplyBumpFee(20*(i+1));
        }

        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        CAmount expected_waste = fee_diff * -2 + change_cost + /*bump_fees=*/60;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());

        selection.SetBumpFeeDiscount(30);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        expected_waste = fee_diff * -2 + change_cost + /*bump_fees=*/60 - /*group_discount=*/30;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());
    }

    {
        // Test with changeless transaction
        //
        // Bump fees and excess both contribute fully to the waste score,
        // therefore, a bump fee group discount will not change the waste
        // score as long as we do not create change in both instances.
        CAmount changeless_target = 3 * COIN - 2 * fee - 100;
        SelectionResult selection{changeless_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, /*fee=*/fee, /*long_term_fee=*/fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        const std::vector<std::shared_ptr<COutput>> inputs = selection.GetShuffledInputVector();

        for (size_t i = 0; i < inputs.size(); ++i) {
            inputs[i]->ApplyBumpFee(20*(i+1));
        }

        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        CAmount expected_waste = fee_diff * -2 + /*bump_fees=*/60 + /*excess = 100 - bump_fees*/40;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());

        selection.SetBumpFeeDiscount(30);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        expected_waste = fee_diff * -2 + /*bump_fees=*/60 - /*group_discount=*/30 + /*excess = 100 - bump_fees + group_discount*/70;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());
    }
}